

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::ContainerPrinter::PrintValue<pstore::chunked_sequence<int,2ul,4ul,4ul>,void>
               (chunked_sequence<int,_2UL,_4UL,_4UL> *container,ostream *os)

{
  bool bVar1;
  reference value;
  value_type *elem;
  const_iterator __end0;
  const_iterator __begin0;
  chunked_sequence<int,_2UL,_4UL,_4UL> *__range3;
  size_t count;
  size_t kMaxCount;
  ostream *os_local;
  chunked_sequence<int,_2UL,_4UL,_4UL> *container_local;
  
  std::operator<<(os,'{');
  __range3 = (chunked_sequence<int,_2UL,_4UL,_4UL> *)0x0;
  join_0x00000010_0x00000000_ = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::begin(container);
  _elem = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::end(container);
  do {
    bVar1 = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<true>::operator!=
                      ((iterator_base<true> *)&__end0.index_,(iterator_base<true> *)&elem);
    if (!bVar1) {
LAB_0014ac2d:
      if (__range3 != (chunked_sequence<int,_2UL,_4UL,_4UL> *)0x0) {
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    value = pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<true>::operator*
                      ((iterator_base<true> *)&__end0.index_);
    if ((__range3 != (chunked_sequence<int,_2UL,_4UL,_4UL> *)0x0) &&
       (std::operator<<(os,','), __range3 == (chunked_sequence<int,_2UL,_4UL,_4UL> *)0x20)) {
      std::operator<<(os," ...");
      goto LAB_0014ac2d;
    }
    std::operator<<(os,' ');
    UniversalPrint<int>(value,os);
    __range3 = (chunked_sequence<int,_2UL,_4UL,_4UL> *)
               ((long)&(__range3->chunks_).
                       super__List_base<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk,_std::allocator<pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::chunk>_>
                       ._M_impl._M_node.super__List_node_base._M_next + 1);
    pstore::chunked_sequence<int,_2UL,_4UL,_4UL>::iterator_base<true>::operator++
              ((iterator_base<true> *)&__end0.index_);
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }